

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall
mjs::parser::make_expression<mjs::literal_expression,mjs::token>(parser *this,token *args)

{
  literal_expression *this_00;
  token *in_RDX;
  source_extend local_40;
  undefined1 local_21;
  token *local_20;
  token *args_local;
  parser *this_local;
  expression_ptr *e;
  
  args_local = args;
  this_local = this;
  if (*(long *)((long)&args[2].field_1 + 0x10) == 0) {
    __assert_fail("expression_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x13d,
                  "expression_ptr mjs::parser::make_expression(Args &&...) [T = mjs::literal_expression, Args = <mjs::token>]"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  this_00 = (literal_expression *)operator_new(0x48);
  position_stack_node::extend(&local_40,*(position_stack_node **)((long)&args[2].field_1 + 0x10));
  literal_expression::literal_expression(this_00,&local_40,local_20);
  std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>::
  unique_ptr<std::default_delete<mjs::expression>,void>
            ((unique_ptr<mjs::expression,std::default_delete<mjs::expression>> *)this,
             (pointer)this_00);
  source_extend::~source_extend(&local_40);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr make_expression(Args&&... args) {
        assert(expression_pos_);
        auto e = expression_ptr{new T{expression_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << e->extend() << " Producting: " << *e << "\n";
#endif
        return e;
    }